

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::decodeNumber(OurReader *this,Token *token,Value *decoded)

{
  bool bVar1;
  char *pcVar2;
  ulong local_f0;
  Value local_e0;
  Value local_b8;
  Value local_80;
  uint local_58;
  char local_51;
  UInt digit;
  Char c;
  LargestUInt value;
  LargestUInt threshold;
  LargestUInt maxIntegerValue;
  char *pcStack_30;
  bool isNegative;
  Location current;
  Value *decoded_local;
  Token *token_local;
  OurReader *this_local;
  
  pcStack_30 = token->start_;
  maxIntegerValue._7_1_ = *pcStack_30 == '-';
  if ((bool)maxIntegerValue._7_1_) {
    pcStack_30 = pcStack_30 + 1;
    local_f0 = 0x8000000000000000;
  }
  else {
    local_f0 = 0xffffffffffffffff;
  }
  threshold = local_f0;
  value = local_f0 / 10;
  _digit = 0;
  while( true ) {
    current = (Location)decoded;
    decoded_local = (Value *)token;
    token_local = (Token *)this;
    if (token->end_ <= pcStack_30) {
      if ((bool)maxIntegerValue._7_1_) {
        Value::Value(&local_80,-_digit);
        Value::operator=((Value *)current,&local_80);
        Value::~Value(&local_80);
      }
      else if (_digit < 0x80000000) {
        Value::Value(&local_b8,_digit);
        Value::operator=((Value *)current,&local_b8);
        Value::~Value(&local_b8);
      }
      else {
        Value::Value(&local_e0,_digit);
        Value::operator=((Value *)current,&local_e0);
        Value::~Value(&local_e0);
      }
      return true;
    }
    pcVar2 = pcStack_30 + 1;
    local_51 = *pcStack_30;
    pcStack_30 = pcVar2;
    if ((local_51 < '0') || ('9' < local_51)) break;
    local_58 = (int)local_51 - 0x30;
    if ((value <= _digit) &&
       (((value < _digit || (pcVar2 != token->end_)) || (local_f0 % 10 < (ulong)local_58)))) {
      bVar1 = decodeDouble(this,token,decoded);
      return bVar1;
    }
    _digit = _digit * 10 + (ulong)local_58;
  }
  bVar1 = decodeDouble(this,token,decoded);
  return bVar1;
}

Assistant:

bool OurReader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  // TODO: Help the compiler do the div and mod at compile time or get rid of them.
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(Value::minLargestInt)
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);
    Value::UInt digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}